

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testValidPadding(void)

{
  ulong uVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this_00;
  PaddingLayerParams *this_01;
  BorderAmounts *pBVar7;
  ostream *poVar8;
  undefined8 *puVar9;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input",puVar9);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  this = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,5);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"probs",puVar9);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  pNVar6 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m1);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  this_01 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_padding(this_00);
  pBVar7 = CoreML::Specification::PaddingLayerParams::_internal_mutable_paddingamounts(this_01);
  google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::Add
            (&pBVar7->borderamounts_);
  pBVar7 = CoreML::Specification::PaddingLayerParams::_internal_mutable_paddingamounts(this_01);
  google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::Add
            (&pBVar7->borderamounts_);
  CoreML::Specification::PaddingLayerParams::_internal_mutable_constant(this_01);
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar2 = CoreML::Result::good(&res);
  if (!bVar2) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xba5);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"(res).good()");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)!bVar2;
}

Assistant:

int testValidPadding() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *paddingLayer = nn->add_layers();
    paddingLayer->add_input("input");
    paddingLayer->add_output("probs");
    auto *params = paddingLayer->mutable_padding();

    // If border amounts set, they need to be set in both directions
    params->mutable_paddingamounts()->add_borderamounts();
    params->mutable_paddingamounts()->add_borderamounts();

    (void)params->mutable_constant();

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}